

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

Value * __thiscall cmake::ReportCapabilitiesJson(Value *__return_storage_ptr__,cmake *this)

{
  String *pSVar1;
  pointer pGVar2;
  Value *pVVar3;
  mapped_type *pmVar4;
  cmake *this_00;
  String *value;
  long *plVar5;
  pointer value_00;
  Value supportedPlatforms;
  Value generators;
  vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_> generatorInfoList;
  JsonValueMapType generatorMap;
  Value local_100;
  Value local_d8;
  curl_version_info_data *local_b0;
  vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_> local_a8;
  ValueHolder local_90;
  undefined8 local_88;
  long *local_80;
  undefined8 uStack_78;
  undefined4 local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  Value local_58;
  
  this_00 = (cmake *)0x7;
  Json::Value::Value(__return_storage_ptr__,objectValue);
  ReportVersionJson((Value *)&local_90,this_00);
  pVVar3 = Json::Value::operator[](__return_storage_ptr__,"version");
  Json::Value::operator=(pVVar3,(Value *)&local_90);
  Json::Value::~Value((Value *)&local_90);
  local_a8.super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GetRegisteredGenerators(this,&local_a8,true);
  local_b0 = curl_version_info(CURLVERSION_FIRST);
  pGVar2 = local_a8.super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_90.string_ = (char *)&uStack_60;
  local_88 = 1;
  local_80 = (long *)0x0;
  uStack_78 = 0;
  local_70 = 0x3f800000;
  local_68 = 0;
  uStack_60 = 0;
  if (local_a8.super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_a8.super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    value_00 = local_a8.
               super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>.
               _M_impl.super__Vector_impl_data._M_start;
    do {
      if (value_00->isAlias == false) {
        if ((value_00->extraName)._M_string_length == 0) {
          Json::Value::Value(&local_d8,objectValue);
          Json::Value::Value(&local_100,&value_00->name);
          pVVar3 = Json::Value::operator[](&local_d8,"name");
          Json::Value::operator=(pVVar3,&local_100);
          Json::Value::~Value(&local_100);
          Json::Value::Value(&local_100,value_00->supportsToolset);
          pVVar3 = Json::Value::operator[](&local_d8,"toolsetSupport");
          Json::Value::operator=(pVVar3,&local_100);
          Json::Value::~Value(&local_100);
          Json::Value::Value(&local_100,value_00->supportsPlatform);
          pVVar3 = Json::Value::operator[](&local_d8,"platformSupport");
          Json::Value::operator=(pVVar3,&local_100);
          Json::Value::~Value(&local_100);
          if ((value_00->supportedPlatforms).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              (value_00->supportedPlatforms).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            Json::Value::Value(&local_100,arrayValue);
            pSVar1 = (value_00->supportedPlatforms).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (value = (value_00->supportedPlatforms).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; value != pSVar1;
                value = value + 1) {
              Json::Value::Value(&local_58,value);
              Json::Value::append(&local_100,&local_58);
              Json::Value::~Value(&local_58);
            }
            pVVar3 = Json::Value::operator[](&local_d8,"supportedPlatforms");
            Json::Value::operator=(pVVar3,&local_100);
            Json::Value::~Value(&local_100);
          }
          Json::Value::Value(&local_100,arrayValue);
          pVVar3 = Json::Value::operator[](&local_d8,"extraGenerators");
          Json::Value::operator=(pVVar3,&local_100);
          Json::Value::~Value(&local_100);
          pmVar4 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)&local_90.bool_,&value_00->name);
          Json::Value::operator=(pmVar4,&local_d8);
        }
        else {
          pmVar4 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)&local_90.bool_,&value_00->baseName);
          pVVar3 = Json::Value::operator[](pmVar4,"extraGenerators");
          Json::Value::Value(&local_d8,&value_00->extraName);
          Json::Value::append(pVVar3,&local_d8);
        }
        Json::Value::~Value(&local_d8);
      }
      value_00 = value_00 + 1;
    } while (value_00 != pGVar2);
  }
  Json::Value::Value(&local_d8,arrayValue);
  if (local_80 != (long *)0x0) {
    plVar5 = local_80;
    do {
      Json::Value::append(&local_d8,(Value *)(plVar5 + 5));
      plVar5 = (long *)*plVar5;
    } while (plVar5 != (long *)0x0);
  }
  pVVar3 = Json::Value::operator[](__return_storage_ptr__,"generators");
  Json::Value::operator=(pVVar3,&local_d8);
  cmFileAPI::ReportCapabilities();
  pVVar3 = Json::Value::operator[](__return_storage_ptr__,"fileApi");
  Json::Value::operator=(pVVar3,&local_100);
  Json::Value::~Value(&local_100);
  Json::Value::Value(&local_100,false);
  pVVar3 = Json::Value::operator[](__return_storage_ptr__,"serverMode");
  Json::Value::operator=(pVVar3,&local_100);
  Json::Value::~Value(&local_100);
  Json::Value::Value(&local_100,SUB41((local_b0->features & 4U) >> 2,0));
  pVVar3 = Json::Value::operator[](__return_storage_ptr__,"tls");
  Json::Value::operator=(pVVar3,&local_100);
  Json::Value::~Value(&local_100);
  Json::Value::~Value(&local_d8);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Json::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&local_90);
  std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>::~vector(&local_a8);
  return __return_storage_ptr__;
}

Assistant:

Json::Value cmake::ReportCapabilitiesJson() const
{
  Json::Value obj = Json::objectValue;

  // Version information:
  obj["version"] = this->ReportVersionJson();

  // Generators:
  std::vector<cmake::GeneratorInfo> generatorInfoList;
  this->GetRegisteredGenerators(generatorInfoList);

  auto* curlVersion = curl_version_info(CURLVERSION_FIRST);

  JsonValueMapType generatorMap;
  for (cmake::GeneratorInfo const& gi : generatorInfoList) {
    if (gi.isAlias) { // skip aliases, they are there for compatibility reasons
                      // only
      continue;
    }

    if (gi.extraName.empty()) {
      Json::Value gen = Json::objectValue;
      gen["name"] = gi.name;
      gen["toolsetSupport"] = gi.supportsToolset;
      gen["platformSupport"] = gi.supportsPlatform;
      if (!gi.supportedPlatforms.empty()) {
        Json::Value supportedPlatforms = Json::arrayValue;
        for (std::string const& platform : gi.supportedPlatforms) {
          supportedPlatforms.append(platform);
        }
        gen["supportedPlatforms"] = std::move(supportedPlatforms);
      }
      gen["extraGenerators"] = Json::arrayValue;
      generatorMap[gi.name] = gen;
    } else {
      Json::Value& gen = generatorMap[gi.baseName];
      gen["extraGenerators"].append(gi.extraName);
    }
  }

  Json::Value generators = Json::arrayValue;
  for (auto const& i : generatorMap) {
    generators.append(i.second);
  }
  obj["generators"] = generators;
  obj["fileApi"] = cmFileAPI::ReportCapabilities();
  obj["serverMode"] = false;
  obj["tls"] = static_cast<bool>(curlVersion->features & CURL_VERSION_SSL);

  return obj;
}